

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int __thiscall ON_Mesh::CullUnusedVertices(ON_Mesh *this)

{
  uint uVar1;
  uint uVar2;
  uint vcount0;
  ON_Mesh *this_local;
  
  uVar1 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  DeleteComponents(this,(ON_COMPONENT_INDEX *)0x0,0,true,false,true,false);
  uVar2 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  if (uVar2 == 0) {
    Destroy(this);
  }
  uVar2 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  return uVar1 - uVar2;
}

Assistant:

int ON_Mesh::CullUnusedVertices()
{
  const unsigned int vcount0 = m_V.UnsignedCount();

  DeleteComponents(
    nullptr, // ci_list
    0,       // ci_count
    true,    // bIgnoreInvalidComponents
    false,   // bRemoveDegenerateFaces
    true,    // bRemoveUnusedVertices
    false    // bRemoveEmptyNgons
    );

  if ( 0 == m_V.UnsignedCount() )
    Destroy();

  return ((int)(vcount0 - m_V.UnsignedCount()));
}